

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O1

bool __thiscall
duckdb::LateMaterialization::TryLateMaterialization
          (LateMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  undefined8 uVar1;
  undefined8 uVar2;
  LogicalOperatorType LVar3;
  pointer pCVar4;
  pointer pCVar5;
  pointer puVar6;
  pointer pBVar7;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var8;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> _Var9;
  undefined1 auVar10 [8];
  undefined8 uVar11;
  int iVar12;
  type pLVar13;
  pointer pLVar14;
  reference pvVar15;
  LogicalProjection *pLVar16;
  _Rb_tree_node_base *p_Var17;
  LogicalGet *this_00;
  vector<duckdb::ColumnIndex,_true> *pvVar18;
  __node_base_ptr p_Var19;
  type this_01;
  reference pvVar20;
  pointer pEVar21;
  ulong uVar22;
  LogicalTopN *pLVar23;
  idx_t iVar24;
  idx_t iVar25;
  LogicalComparisonJoin *this_02;
  pointer pLVar26;
  LogicalOrder *pLVar27;
  pointer pLVar28;
  type expr_00;
  pointer pLVar29;
  InternalException *this_03;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_1;
  pointer puVar30;
  ulong __n;
  long lVar31;
  pointer pBVar32;
  type pLVar33;
  _Hash_node_base *p_Var34;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_2;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_01;
  long lVar35;
  bool bVar36;
  templated_unique_single_t proj;
  templated_unique_single_t order_1;
  templated_unique_single_t join;
  reference<LogicalOperator> child;
  unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> lhs;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> referenced_columns;
  column_binding_map_t<ReferencedColumn> *__range4;
  vector<duckdb::BoundOrderByNode,_true> final_orders;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  final_proj_list;
  vector<std::reference_wrapper<duckdb::LogicalOperator>,_true> source_operators;
  JoinCondition condition;
  ColumnBinding rhs_binding;
  ColumnBinding lhs_binding;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_158;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_150;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> local_148;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_140
  ;
  reference_wrapper<duckdb::LogicalOperator> local_138;
  undefined1 local_130 [8];
  undefined1 local_128 [8];
  undefined1 auStack_120 [24];
  _Rb_tree_node_base *p_Stack_108;
  pointer local_100;
  __node_base_ptr local_f8;
  Optimizer *pOStack_f0;
  undefined1 local_e8 [16];
  bool local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  undefined1 local_c8 [16];
  _Base_ptr local_b8;
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [16];
  ExpressionType local_58;
  ColumnBinding local_50;
  ColumnBinding local_40;
  
  local_88._0_16_ = (undefined1  [16])0x0;
  local_88._16_8_ = (reference_wrapper<duckdb::LogicalOperator> *)0x0;
  local_140 = op;
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(op);
  LogicalOperatorVisitor::VisitOperatorExpressions((LogicalOperatorVisitor *)this,pLVar13);
  pLVar14 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(local_140);
  pvVar15 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](&pLVar14->children,0);
  local_138._M_data =
       unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
       operator*(pvVar15);
  local_d0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       &(this->super_BaseColumnPruner).column_references;
  while( true ) {
    while (LVar3 = (local_138._M_data)->type, LVar3 == LOGICAL_PROJECTION) {
      pLVar16 = LogicalOperator::Cast<duckdb::LogicalProjection>(local_138._M_data);
      if (local_88._8_8_ == local_88._16_8_) {
        ::std::
        vector<std::reference_wrapper<duckdb::LogicalOperator>,std::allocator<std::reference_wrapper<duckdb::LogicalOperator>>>
        ::_M_realloc_insert<std::reference_wrapper<duckdb::LogicalOperator>const&>
                  ((vector<std::reference_wrapper<duckdb::LogicalOperator>,std::allocator<std::reference_wrapper<duckdb::LogicalOperator>>>
                    *)local_88,(iterator)local_88._8_8_,&local_138);
      }
      else {
        *(LogicalOperator **)local_88._8_8_ = local_138._M_data;
        local_88._8_8_ = (reference_wrapper<duckdb::LogicalOperator> *)(local_88._8_8_ + 8);
      }
      puVar6 = (pLVar16->super_LogicalOperator).expressions.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar30 = (pLVar16->super_LogicalOperator).expressions.
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; bVar36 = puVar30 != puVar6, bVar36;
          puVar30 = puVar30 + 1) {
        pEVar21 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(puVar30);
        iVar12 = (*(pEVar21->super_BaseExpression)._vptr_BaseExpression[0xc])(pEVar21);
        if ((char)iVar12 != '\0') goto LAB_0118b01f;
      }
      auStack_120._0_8_ = auStack_120._0_8_ & 0xffffffff00000000;
      auStack_120._8_8_ = (_Base_ptr)0x0;
      local_100 = (pointer)0x0;
      auStack_120._16_8_ = (_Rb_tree_node_base *)auStack_120;
      p_Stack_108 = (_Rb_tree_node_base *)auStack_120;
      for (p_Var34 = (this->super_BaseColumnPruner).column_references._M_h._M_before_begin._M_nxt;
          p_Var34 != (_Hash_node_base *)0x0; p_Var34 = p_Var34->_M_nxt) {
        if (p_Var34[1]._M_nxt == (_Hash_node_base *)pLVar16->table_index) {
          ::std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)local_128,(unsigned_long *)(p_Var34 + 2));
        }
      }
      ::std::
      _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)local_d0._M_pi);
      if ((_Rb_tree_node_base *)auStack_120._16_8_ != (_Rb_tree_node_base *)auStack_120) {
        p_Var17 = (_Rb_tree_node_base *)auStack_120._16_8_;
        do {
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          ::operator[](&(pLVar16->super_LogicalOperator).expressions,*(size_type *)(p_Var17 + 1));
          (*(this->super_BaseColumnPruner).super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor
            [3])(this);
          p_Var17 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var17);
        } while (p_Var17 != (_Rb_tree_node_base *)auStack_120);
      }
      pvVar15 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::operator[](&(local_138._M_data)->children,0);
      local_138._M_data =
           unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar15);
      ::std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_128);
      if (bVar36) goto LAB_0118b01f;
    }
    if (LVar3 != LOGICAL_FILTER) break;
    LogicalOperatorVisitor::VisitOperatorExpressions
              ((LogicalOperatorVisitor *)this,local_138._M_data);
    pvVar15 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](&(local_138._M_data)->children,0);
    local_138._M_data =
         unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
         operator*(pvVar15);
  }
  if (LVar3 == LOGICAL_GET) {
    this_00 = LogicalOperator::Cast<duckdb::LogicalGet>(local_138._M_data);
    uVar22 = (this->super_BaseColumnPruner).column_references._M_h._M_element_count;
    pvVar18 = LogicalGet::GetColumnIds(this_00);
    if ((uVar22 < (ulong)((long)(pvVar18->
                                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                ).
                                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar18->
                                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                ).
                                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) &&
       ((this_00->function).late_materialization == true)) {
      p_Var19 = ::std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::_M_find_before_node
                          (&(this_00->virtual_columns)._M_h,
                           0xffffffffffffffff % (this_00->virtual_columns)._M_h._M_bucket_count,
                           &COLUMN_IDENTIFIER_ROW_ID,0xffffffffffffffff);
      if (p_Var19 == (__node_base_ptr)0x0) {
        p_Var34 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var34 = p_Var19->_M_nxt;
      }
      if (p_Var34 == (_Hash_node_base *)0x0) {
        this_03 = (InternalException *)__cxa_allocate_exception(0x10);
        local_128 = (undefined1  [8])((long)auStack_120 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_128,
                   "Table function supports late materialization but does not expose a rowid column"
                   ,"");
        InternalException::InternalException(this_03,(string *)local_128);
        __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->row_id_type;
      if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(p_Var34 + 6)) {
        (this->row_id_type).id_ = *(LogicalTypeId *)&p_Var34[6]._M_nxt;
        (this->row_id_type).physical_type_ = *(PhysicalType *)((long)&p_Var34[6]._M_nxt + 1);
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(this->row_id_type).type_info_,
                   (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(p_Var34 + 7));
      }
      ConstructLHS((LateMaterialization *)local_130,(LogicalGet *)this);
      this_01 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                operator*((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                           *)local_130);
      iVar24 = this_01->table_index;
      pvVar18 = LogicalGet::GetColumnIds(this_01);
      pCVar4 = (pvVar18->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
               .super__Vector_impl_data._M_start;
      pCVar5 = (pvVar18->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pLVar33 = this_01;
      local_40.column_index = GetOrInsertRowId(this,this_01);
      local_a8._0_16_ = (undefined1  [16])0x0;
      local_a8._16_8_ = (_Base_ptr)0x0;
      local_40.table_index = iVar24;
      if (local_88._0_8_ == local_88._8_8_) {
        if (pCVar5 != pCVar4) {
          lVar35 = (long)pCVar5 - (long)pCVar4 >> 5;
          lVar31 = 0;
          do {
            GetExpression((LateMaterialization *)local_128,&pLVar33->super_LogicalOperator,
                          (idx_t)this_01);
            pLVar33 = (type)local_128;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)local_a8,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_128);
            if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_128 !=
                (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
              (*(code *)(*(__node_base_ptr *)local_128)[1]._M_nxt)();
            }
            lVar31 = lVar31 + 1;
          } while (lVar35 + (ulong)(lVar35 == 0) != lVar31);
        }
      }
      else {
        pvVar20 = vector<std::reference_wrapper<duckdb::LogicalOperator>,_true>::operator[]
                            ((vector<std::reference_wrapper<duckdb::LogicalOperator>,_true> *)
                             local_88,0);
        puVar30 = (pvVar20->_M_data->expressions).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar6 = (pvVar20->_M_data->expressions).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar30 != puVar6) {
          do {
            pEVar21 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(puVar30);
            (*(pEVar21->super_BaseExpression)._vptr_BaseExpression[0x11])
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_128,pEVar21);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)local_a8,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_128);
            if (local_128 != (undefined1  [8])0x0) {
              (*(code *)((__node_base_ptr)((BaseExpression *)local_128)->_vptr_BaseExpression)[1].
                        _M_nxt)();
            }
            puVar30 = puVar30 + 1;
          } while (puVar30 != puVar6);
        }
        if (local_88._8_8_ - local_88._0_8_ != 0) {
          uVar22 = (long)(local_88._8_8_ - local_88._0_8_) >> 3;
          __n = 0;
          do {
            __n = __n + 1;
            pLVar33 = this_01;
            if (__n < uVar22) {
              pvVar20 = vector<std::reference_wrapper<duckdb::LogicalOperator>,_true>::operator[]
                                  ((vector<std::reference_wrapper<duckdb::LogicalOperator>,_true> *)
                                   local_88,__n);
              pLVar33 = (type)pvVar20->_M_data;
            }
            uVar11 = local_a8._8_8_;
            for (expr_01 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_a8._0_8_;
                expr_01 !=
                (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                uVar11; expr_01 = expr_01 + 1) {
              ReplaceExpressionReferences(this,&pLVar33->super_LogicalOperator,expr_01);
            }
            uVar22 = (long)(local_88._8_8_ - local_88._0_8_) >> 3;
          } while (__n < uVar22);
        }
      }
      local_c8 = (undefined1  [16])0x0;
      local_b8 = (_Base_ptr)0x0;
      pLVar14 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(local_140);
      LVar3 = pLVar14->type;
      if (LVar3 == LOGICAL_TOP_N) {
        pLVar14 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->(local_140);
        pLVar23 = LogicalOperator::Cast<duckdb::LogicalTopN>(pLVar14);
        pBVar32 = (pLVar23->orders).
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar7 = (pLVar23->orders).
                 super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pBVar32 != pBVar7) {
          do {
            pEVar21 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(&pBVar32->expression);
            (*(pEVar21->super_BaseExpression)._vptr_BaseExpression[0x11])
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_128,pEVar21);
            ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
            emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                       local_c8,&pBVar32->type,&pBVar32->null_order,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_128);
            if (local_128 != (undefined1  [8])0x0) {
              (*(code *)((__node_base_ptr)((BaseExpression *)local_128)->_vptr_BaseExpression)[1].
                        _M_nxt)();
            }
            pBVar32 = pBVar32 + 1;
          } while (pBVar32 != pBVar7);
        }
      }
      else {
        make_uniq<duckdb::BoundColumnRefExpression,char_const(&)[6],duckdb::LogicalType&,duckdb::ColumnBinding&>
                  ((duckdb *)local_128,(char (*) [6])0x1e25a1b,(LogicalType *)local_d0._M_pi,
                   &local_40);
        local_68[0] = 2;
        local_50.table_index._0_1_ = 3;
        ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
        emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<duckdb::BoundColumnRefExpression>,true>>
                  ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                   local_c8,local_68,(OrderByNullType *)&local_50,
                   (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                    *)local_128);
        if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_128 !=
            (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
          (*(code *)((__node_base_ptr)((BaseExpression *)local_128)->_vptr_BaseExpression)[1]._M_nxt
          )();
        }
      }
      local_50 = ConstructRHS(this,local_140);
      iVar24 = local_50.table_index;
      iVar25 = Binder::GenerateTableIndex(this->optimizer->binder);
      local_50.table_index = iVar25;
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator*(local_140);
      ReplaceTopLevelTableIndex(this,pLVar13,local_50.table_index);
      this_02 = (LogicalComparisonJoin *)operator_new(0x118);
      LogicalComparisonJoin::LogicalComparisonJoin(this_02,SEMI,LOGICAL_COMPARISON_JOIN);
      local_148._M_head_impl = this_02;
      pLVar26 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&local_148);
      local_128 = local_130;
      local_130 = (undefined1  [8])0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&(pLVar26->super_LogicalJoin).super_LogicalOperator.children,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)local_128);
      if (local_128 != (undefined1  [8])0x0) {
        (*(code *)((__node_base_ptr)((BaseExpression *)local_128)->_vptr_BaseExpression)[1]._M_nxt)
                  ();
      }
      pLVar26 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&local_148);
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&(pLVar26->super_LogicalJoin).super_LogicalOperator.children,local_140);
      local_68 = (undefined1  [16])0x0;
      local_58 = COMPARE_BOUNDARY_START;
      make_uniq<duckdb::BoundColumnRefExpression,char_const(&)[6],duckdb::LogicalType&,duckdb::ColumnBinding&>
                ((duckdb *)local_128,(char (*) [6])0x1e25a1b,(LogicalType *)local_d0._M_pi,&local_40
                );
      auVar10 = local_128;
      local_128 = (undefined1  [8])0x0;
      uVar11 = local_68._0_8_;
      local_68._0_8_ = auVar10;
      if ((__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
          uVar11 != (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0) {
        (**(code **)(*(long *)uVar11 + 8))();
      }
      if (local_128 != (undefined1  [8])0x0) {
        (*(code *)((__node_base_ptr)((BaseExpression *)local_128)->_vptr_BaseExpression)[1]._M_nxt)
                  ();
      }
      make_uniq<duckdb::BoundColumnRefExpression,char_const(&)[6],duckdb::LogicalType&,duckdb::ColumnBinding&>
                ((duckdb *)local_128,(char (*) [6])0x1e25a1b,(LogicalType *)local_d0._M_pi,&local_50
                );
      auVar10 = local_128;
      local_128 = (undefined1  [8])0x0;
      uVar11 = local_68._8_8_;
      local_68._8_8_ = auVar10;
      if ((__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
          uVar11 != (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0) {
        (**(code **)(*(long *)uVar11 + 8))();
      }
      if (local_128 != (undefined1  [8])0x0) {
        (*(code *)((__node_base_ptr)((BaseExpression *)local_128)->_vptr_BaseExpression)[1]._M_nxt)
                  ();
      }
      pLVar26 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&local_148);
      ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
      emplace_back<duckdb::JoinCondition>
                (&(pLVar26->conditions).
                  super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                 (JoinCondition *)local_68);
      if (LVar3 == LOGICAL_TOP_N) {
        pLVar27 = (LogicalOrder *)operator_new(0x70);
        local_128 = (undefined1  [8])local_a8._0_8_;
        auStack_120._0_8_ = local_a8._8_8_;
        auStack_120._8_8_ = local_a8._16_8_;
        local_a8._0_16_ = (undefined1  [16])0x0;
        local_a8._16_8_ = 0;
        LogicalProjection::LogicalProjection
                  ((LogicalProjection *)pLVar27,iVar24,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)local_128);
        local_158._M_head_impl = (LogicalProjection *)pLVar27;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)local_128);
        pLVar26 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)&local_148);
        if ((pLVar26->super_LogicalJoin).super_LogicalOperator.has_estimated_cardinality == true) {
          pLVar28 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                  *)&local_158);
          pLVar26 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                  *)&local_148);
          LogicalOperator::SetEstimatedCardinality
                    (&pLVar28->super_LogicalOperator,
                     (pLVar26->super_LogicalJoin).super_LogicalOperator.estimated_cardinality);
        }
        pLVar28 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                *)&local_158);
        local_128 = (undefined1  [8])local_148._M_head_impl;
        local_148._M_head_impl = (LogicalComparisonJoin *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                    *)&(pLVar28->super_LogicalOperator).children,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_128);
        if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
            local_128 != (Expression *)0x0) {
          (**(code **)(*(long *)local_128 + 8))();
        }
        uVar11 = local_c8._8_8_;
        for (pBVar32 = (pointer)local_c8._0_8_; pBVar32 != (pointer)uVar11; pBVar32 = pBVar32 + 1) {
          expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(&pBVar32->expression);
          ReplaceTableReferences(this,expr_00,iVar24);
        }
        pLVar27 = (LogicalOrder *)operator_new(0x98);
        local_128 = (undefined1  [8])local_c8._0_8_;
        auStack_120._0_8_ = local_c8._8_8_;
        auStack_120._8_8_ = local_b8;
        local_c8 = (undefined1  [16])0x0;
        local_b8 = (_Base_ptr)0x0;
        LogicalOrder::LogicalOrder(pLVar27,(vector<duckdb::BoundOrderByNode,_true> *)local_128);
        local_150._M_head_impl = (LogicalProjection *)pLVar27;
        ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
                  ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                   local_128);
        pLVar28 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                *)&local_158);
        if ((pLVar28->super_LogicalOperator).has_estimated_cardinality == true) {
          pLVar29 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                  *)&local_150);
          pLVar28 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                  *)&local_158);
          LogicalOperator::SetEstimatedCardinality
                    (&pLVar29->super_LogicalOperator,
                     (pLVar28->super_LogicalOperator).estimated_cardinality);
        }
        pLVar29 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                *)&local_150);
        local_128 = (undefined1  [8])local_158._M_head_impl;
        local_158._M_head_impl = (LogicalProjection *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                    *)&(pLVar29->super_LogicalOperator).children,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_128);
      }
      else {
        pLVar27 = (LogicalOrder *)operator_new(0x98);
        local_128 = (undefined1  [8])local_c8._0_8_;
        auStack_120._0_8_ = local_c8._8_8_;
        auStack_120._8_8_ = local_b8;
        local_c8 = (undefined1  [16])0x0;
        local_b8 = (_Base_ptr)0x0;
        LogicalOrder::LogicalOrder(pLVar27,(vector<duckdb::BoundOrderByNode,_true> *)local_128);
        local_158._M_head_impl = (LogicalProjection *)pLVar27;
        ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
                  ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                   local_128);
        pLVar26 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)&local_148);
        if ((pLVar26->super_LogicalJoin).super_LogicalOperator.has_estimated_cardinality == true) {
          pLVar29 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                  *)&local_158);
          pLVar26 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                  *)&local_148);
          LogicalOperator::SetEstimatedCardinality
                    (&pLVar29->super_LogicalOperator,
                     (pLVar26->super_LogicalJoin).super_LogicalOperator.estimated_cardinality);
        }
        pLVar29 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                *)&local_158);
        local_128 = (undefined1  [8])local_148._M_head_impl;
        local_148._M_head_impl = (LogicalComparisonJoin *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                    *)&(pLVar29->super_LogicalOperator).children,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_128);
        if (local_128 != (undefined1  [8])0x0) {
          (*(((LogicalJoin *)local_128)->super_LogicalOperator)._vptr_LogicalOperator[1])();
        }
        pLVar27 = (LogicalOrder *)operator_new(0x70);
        local_128 = (undefined1  [8])local_a8._0_8_;
        auStack_120._0_8_ = local_a8._8_8_;
        auStack_120._8_8_ = local_a8._16_8_;
        local_a8._0_16_ = (undefined1  [16])0x0;
        local_a8._16_8_ = 0;
        LogicalProjection::LogicalProjection
                  ((LogicalProjection *)pLVar27,iVar24,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)local_128);
        local_150._M_head_impl = (LogicalProjection *)pLVar27;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)local_128);
        pLVar29 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                *)&local_158);
        if ((pLVar29->super_LogicalOperator).has_estimated_cardinality == true) {
          pLVar28 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                  *)&local_150);
          pLVar29 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                  *)&local_158);
          LogicalOperator::SetEstimatedCardinality
                    (&pLVar28->super_LogicalOperator,
                     (pLVar29->super_LogicalOperator).estimated_cardinality);
        }
        pLVar28 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                *)&local_150);
        local_128 = (undefined1  [8])local_158._M_head_impl;
        local_158._M_head_impl = (LogicalProjection *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                    *)&(pLVar28->super_LogicalOperator).children,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_128);
      }
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(_func_int **)local_128 + 8))();
      }
      _Var9._M_head_impl = local_150._M_head_impl;
      local_150._M_head_impl = (LogicalProjection *)0x0;
      _Var8._M_head_impl =
           (local_140->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_140->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           &(_Var9._M_head_impl)->super_LogicalOperator;
      if (_Var8._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var8._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      if (local_150._M_head_impl != (LogicalProjection *)0x0) {
        (*((local_150._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
      if (local_158._M_head_impl != (LogicalProjection *)0x0) {
        (*((local_158._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
      auStack_120._0_8_ = &pOStack_f0;
      auStack_120._8_8_ = &DAT_00000001;
      uVar1 = this->optimizer->context;
      uVar2 = this->optimizer->binder;
      auStack_120._16_8_ = (_Rb_tree_node_base *)0x0;
      p_Stack_108 = (_Rb_tree_node_base *)0x0;
      local_100 = (pointer)CONCAT44(local_100._4_4_,0x3f800000);
      local_f8 = (__node_base_ptr)0x0;
      pOStack_f0 = (Optimizer *)0x0;
      local_128 = (undefined1  [8])&PTR__BaseColumnPruner_0248c740;
      local_e8._8_4_ = (int)uVar1;
      local_e8._0_8_ = uVar2;
      local_e8._12_4_ = (int)((ulong)uVar1 >> 0x20);
      local_d8 = true;
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator*(local_140);
      RemoveUnusedColumns::VisitOperator((RemoveUnusedColumns *)local_128,pLVar13);
      local_128 = (undefined1  [8])&PTR__BaseColumnPruner_0248c670;
      ::std::
      _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)auStack_120);
      if ((__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
          local_68._8_8_ !=
          (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0) {
        (**(code **)(*(long *)local_68._8_8_ + 8))();
      }
      local_68._8_8_ = 0;
      if ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
          local_68._0_8_ !=
          (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)0x0) {
        (**(code **)(*(long *)local_68._0_8_ + 8))();
      }
      if (local_148._M_head_impl != (LogicalComparisonJoin *)0x0) {
        (*((local_148._M_head_impl)->super_LogicalJoin).super_LogicalOperator._vptr_LogicalOperator
          [1])();
      }
      ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
                ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                 local_c8);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_a8);
      if (local_130 != (undefined1  [8])0x0) {
        (**(code **)(*(_func_int **)local_130 + 8))();
      }
      bVar36 = true;
      goto LAB_0118b021;
    }
  }
LAB_0118b01f:
  bVar36 = false;
LAB_0118b021:
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_);
  }
  return bVar36;
}

Assistant:

bool LateMaterialization::TryLateMaterialization(unique_ptr<LogicalOperator> &op) {
	// check if we can benefit from late materialization
	// we need to see how many columns we require in the pipeline versus how many columns we emit in the scan
	// for example, in a query like SELECT * FROM tbl ORDER BY ts LIMIT 5, the top-n only needs the "ts" column
	// the other columns can be fetched later on using late materialization
	// we can only push late materialization through a subset of operators
	// and we can only do it for scans that support the row-id pushdown (currently only DuckDB table scans)

	// visit the expressions for each operator in the chain
	vector<reference<LogicalOperator>> source_operators;

	VisitOperatorExpressions(*op);
	reference<LogicalOperator> child = *op->children[0];
	while (child.get().type != LogicalOperatorType::LOGICAL_GET) {
		switch (child.get().type) {
		case LogicalOperatorType::LOGICAL_PROJECTION: {
			// recurse into the child node - but ONLY visit expressions that are referenced
			auto &proj = child.get().Cast<LogicalProjection>();
			source_operators.push_back(child);

			for (auto &expr : proj.expressions) {
				if (expr->IsVolatile()) {
					// we cannot do this optimization if any of the columns are volatile
					return false;
				}
			}

			// figure out which projection expressions we are currently referencing
			set<idx_t> referenced_columns;
			for (auto &entry : column_references) {
				auto &column_binding = entry.first;
				if (column_binding.table_index == proj.table_index) {
					referenced_columns.insert(column_binding.column_index);
				}
			}
			// clear the list of referenced expressions and visit those columns
			column_references.clear();
			for (auto &col_idx : referenced_columns) {
				VisitExpression(&proj.expressions[col_idx]);
			}
			// continue into child
			child = *child.get().children[0];
			break;
		}
		case LogicalOperatorType::LOGICAL_FILTER: {
			// visit filter expressions - we need these columns
			VisitOperatorExpressions(child.get());
			// continue into child
			child = *child.get().children[0];
			break;
		}
		default:
			// unsupported operator for late materialization
			return false;
		}
	}
	auto &get = child.get().Cast<LogicalGet>();
	if (column_references.size() >= get.GetColumnIds().size()) {
		// we do not benefit from late materialization
		// we need all of the columns to compute the root node anyway (Top-N/Limit/etc)
		return false;
	}
	if (!get.function.late_materialization) {
		// this function does not support late materialization
		return false;
	}
	auto entry = get.virtual_columns.find(COLUMN_IDENTIFIER_ROW_ID);
	if (entry == get.virtual_columns.end()) {
		throw InternalException("Table function supports late materialization but does not expose a rowid column");
	}
	row_id_type = entry->second.type;
	// we benefit from late materialization
	// we need to transform this plan into a semi-join with the row-id
	// we need to ensure the operator returns exactly the same column bindings as before

	// construct the LHS from the LogicalGet
	auto lhs = ConstructLHS(get);
	// insert the row-id column on the left hand side
	auto &lhs_get = *lhs;
	auto lhs_index = lhs_get.table_index;
	auto lhs_columns = lhs_get.GetColumnIds().size();
	auto lhs_row_idx = GetOrInsertRowId(lhs_get);
	ColumnBinding lhs_binding(lhs_index, lhs_row_idx);

	// after constructing the LHS but before constructing the RHS we construct the final projections/orders
	// - we do this before constructing the RHS because that alter the original plan
	vector<unique_ptr<Expression>> final_proj_list;
	// construct the final projection list from either (1) the root projection, or (2) the logical get
	if (!source_operators.empty()) {
		// construct the columns from the root projection
		auto &root_proj = source_operators[0].get();
		for (auto &expr : root_proj.expressions) {
			final_proj_list.push_back(expr->Copy());
		}
		// now we need to "flatten" the projection list by traversing the set of projections and inlining them
		for (idx_t i = 0; i < source_operators.size(); i++) {
			auto &next_operator = i + 1 < source_operators.size() ? source_operators[i + 1].get() : lhs_get;
			for (auto &expr : final_proj_list) {
				ReplaceExpressionReferences(next_operator, expr);
			}
		}
	} else {
		// if we have no projection directly construct the columns from the root get
		for (idx_t i = 0; i < lhs_columns; i++) {
			final_proj_list.push_back(GetExpression(lhs_get, i));
		}
	}

	// we need to re-order again at the end
	vector<BoundOrderByNode> final_orders;
	auto root_type = op->type;
	if (root_type == LogicalOperatorType::LOGICAL_TOP_N) {
		// for top-n we need to re-order by the top-n conditions
		auto &top_n = op->Cast<LogicalTopN>();
		for (auto &order : top_n.orders) {
			auto expr = order.expression->Copy();
			final_orders.emplace_back(order.type, order.null_order, std::move(expr));
		}
	} else {
		// for limit/sample we order by row-id
		auto row_id_expr = make_uniq<BoundColumnRefExpression>("rowid", row_id_type, lhs_binding);
		final_orders.emplace_back(OrderType::ASCENDING, OrderByNullType::NULLS_LAST, std::move(row_id_expr));
	}

	// construct the RHS for the join
	// this is essentially the old pipeline, but with the `rowid` column added
	// note that the purpose of this optimization is to remove columns from the RHS
	// we don't do that here yet though - we do this in a later step using the RemoveUnusedColumns optimizer
	auto rhs_binding = ConstructRHS(op);

	// the final table index emitted must be the table index of the original operator
	// this ensures any upstream operators that refer to the original get will keep on referring to the correct columns
	auto final_index = rhs_binding.table_index;

	// we need to replace any references to "rhs_binding.table_index" in the rhs to a new table index
	rhs_binding.table_index = optimizer.binder.GenerateTableIndex();
	ReplaceTopLevelTableIndex(*op, rhs_binding.table_index);

	// construct a semi join between the lhs and rhs
	auto join = make_uniq<LogicalComparisonJoin>(JoinType::SEMI);
	join->children.push_back(std::move(lhs));
	join->children.push_back(std::move(op));
	JoinCondition condition;
	condition.comparison = ExpressionType::COMPARE_EQUAL;
	condition.left = make_uniq<BoundColumnRefExpression>("rowid", row_id_type, lhs_binding);
	condition.right = make_uniq<BoundColumnRefExpression>("rowid", row_id_type, rhs_binding);
	join->conditions.push_back(std::move(condition));

	// push a projection that removes the row id again from the lhs
	// this is the final projection - so it should have the final table index
	auto proj_index = final_index;
	if (root_type == LogicalOperatorType::LOGICAL_TOP_N) {
		// for top-n we need to order on expressions, so we need to order AFTER the final projection
		auto proj = make_uniq<LogicalProjection>(proj_index, std::move(final_proj_list));
		if (join->has_estimated_cardinality) {
			proj->SetEstimatedCardinality(join->estimated_cardinality);
		}
		proj->children.push_back(std::move(join));

		for (auto &order : final_orders) {
			ReplaceTableReferences(*order.expression, proj_index);
		}
		auto order = make_uniq<LogicalOrder>(std::move(final_orders));
		if (proj->has_estimated_cardinality) {
			order->SetEstimatedCardinality(proj->estimated_cardinality);
		}
		order->children.push_back(std::move(proj));

		op = std::move(order);
	} else {
		// for limit/sample we order on row-id, so we need to order BEFORE the final projection
		// because the final projection removes row-ids
		auto order = make_uniq<LogicalOrder>(std::move(final_orders));
		if (join->has_estimated_cardinality) {
			order->SetEstimatedCardinality(join->estimated_cardinality);
		}
		order->children.push_back(std::move(join));

		auto proj = make_uniq<LogicalProjection>(proj_index, std::move(final_proj_list));
		if (order->has_estimated_cardinality) {
			proj->SetEstimatedCardinality(order->estimated_cardinality);
		}
		proj->children.push_back(std::move(order));

		op = std::move(proj);
	}

	// run the RemoveUnusedColumns optimizer to prune the (now) unused columns the plan
	RemoveUnusedColumns unused_optimizer(optimizer.binder, optimizer.context, true);
	unused_optimizer.VisitOperator(*op);
	return true;
}